

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmWin.c
# Opt level: O0

int Sfm_ObjMffcSize(Sfm_Ntk_t *p,int iObj)

{
  int iVar1;
  int Count2;
  int Count1;
  int iObj_local;
  Sfm_Ntk_t *p_local;
  
  iVar1 = Sfm_ObjIsPi(p,iObj);
  if (iVar1 == 0) {
    iVar1 = Sfm_ObjFanoutNum(p,iObj);
    if (iVar1 == 1) {
      iVar1 = Sfm_ObjIsNode(p,iObj);
      if (iVar1 == 0) {
        __assert_fail("Sfm_ObjIsNode( p, iObj )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmWin.c"
                      ,0x60,"int Sfm_ObjMffcSize(Sfm_Ntk_t *, int)");
      }
      p_local._4_4_ = Sfm_ObjDeref(p,iObj);
      iVar1 = Sfm_ObjRef(p,iObj);
      if (p_local._4_4_ != iVar1) {
        __assert_fail("Count1 == Count2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmWin.c"
                      ,99,"int Sfm_ObjMffcSize(Sfm_Ntk_t *, int)");
      }
    }
    else {
      p_local._4_4_ = 0;
    }
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Sfm_ObjMffcSize( Sfm_Ntk_t * p, int iObj )
{
    int Count1, Count2;
    if ( Sfm_ObjIsPi(p, iObj) )
        return 0;
    if ( Sfm_ObjFanoutNum(p, iObj) != 1 )
        return 0;
    assert( Sfm_ObjIsNode( p, iObj ) );
    Count1 = Sfm_ObjDeref( p, iObj );
    Count2 = Sfm_ObjRef( p, iObj );
    assert( Count1 == Count2 );
    return Count1;
}